

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplesUtil.cpp
# Opt level: O0

RecordingData *
aeron::archive::getLatestRecordingData
          (RecordingData *__return_storage_ptr__,AeronArchive *archive,string *channel,
          int32_t streamId)

{
  RecordingDescriptorConsumer local_48;
  anon_class_8_1_6971b95b local_28;
  anon_class_8_1_6971b95b consumer;
  int32_t streamId_local;
  string *channel_local;
  AeronArchive *archive_local;
  
  __return_storage_ptr__->recordingId = -1;
  local_28.result = __return_storage_ptr__;
  consumer.result._4_4_ = streamId;
  std::
  function<void(long,long,long,long,long,long,long,int,int,int,int,int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
  ::
  function<aeron::archive::getLatestRecordingData(aeron::archive::AeronArchive&,std::__cxx11::string_const&,int)::__0&,void>
            ((function<void(long,long,long,long,long,long,long,int,int,int,int,int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
              *)&local_48,&local_28);
  AeronArchive::listRecordingsForUri(archive,0,100,channel,streamId,&local_48);
  std::
  function<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_48);
  return __return_storage_ptr__;
}

Assistant:

RecordingData getLatestRecordingData(aeron::archive::AeronArchive& archive, const std::string& channel,
                                     std::int32_t streamId) {
    RecordingData result;
    result.recordingId = -1;

    auto consumer = [&](long controlSessionId, long correlationId, long recordingId, long startTimestamp,
                        long stopTimestamp, long startPosition, long stopPosition, int initialTermId,
                        int segmentFileLength, int termBufferLength, int mtuLength, int sessionId, int streamId,
                        const std::string& strippedChannel, const std::string& originalChannel,
                        const std::string& sourceIdentity) {
        result.recordingId = recordingId;
        result.stopPosition = stopPosition;
        result.initialTermId = initialTermId;
        result.termBufferLength = termBufferLength;
    };

    archive.listRecordingsForUri(0, 100, channel, streamId, consumer);
    return result;
}